

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::SetWritable
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  code *pcVar1;
  JavascriptLibrary *typeHandler_00;
  uint propertyKey;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ScriptContext *pSVar5;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  DynamicTypeHandler *pDVar6;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_01;
  undefined1 local_58 [16];
  JavascriptLibrary *library;
  DynamicTypeHandler *typeHandler;
  Type *oldType;
  PropertyRecord *propertyRecord;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  BOOL value_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_local;
  
  descriptor._0_4_ = value;
  descriptor._4_4_ = propertyId;
  _value_local = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)this;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x7cd,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)_value_local);
  oldType = (Type *)ScriptContext::GetPropertyName(pSVar5,descriptor._4_4_);
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,(PropertyRecord **)&oldType,
                     (SimpleDictionaryPropertyDescriptor<unsigned_short> **)&propertyRecord);
  if (bVar2) {
    if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject & 0x1000) == 0) {
      typeHandler = (DynamicTypeHandler *)
                    RecyclableObject::GetType((RecyclableObject *)_value_local);
      if ((uint)descriptor == 0) {
        BVar3 = ClearAttribute(this,(DynamicObject *)_value_local,
                               (SimpleDictionaryPropertyDescriptor<unsigned_short> *)propertyRecord,
                               '\x04');
        if (BVar3 != 0) {
          DynamicObject::ChangeTypeIf((DynamicObject *)_value_local,(Type *)typeHandler);
          library = (JavascriptLibrary *)
                    DynamicTypeHandler::GetCurrentTypeHandler((DynamicObject *)_value_local);
          local_58._8_8_ = RecyclableObject::GetLibrary((RecyclableObject *)_value_local);
          JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
                    ((JavascriptLibrary *)local_58);
          this_01 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                    ::operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                                  *)local_58);
          propertyKey = descriptor._4_4_;
          typeHandler_00 = library;
          pSVar5 = JavascriptLibrary::GetScriptContext((JavascriptLibrary *)local_58._8_8_);
          PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
                    (this_01,(DynamicTypeHandler *)typeHandler_00,'\0',propertyKey,pSVar5);
        }
      }
      else {
        BVar3 = SetAttribute(this,(DynamicObject *)_value_local,
                             (SimpleDictionaryPropertyDescriptor<unsigned_short> *)propertyRecord,
                             '\x04');
        if (BVar3 != 0) {
          DynamicObject::ChangeTypeIf((DynamicObject *)_value_local,(Type *)typeHandler);
        }
      }
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    bVar2 = DynamicObject::HasObjectArray((DynamicObject *)_value_local);
    if ((bVar2) && (bVar2 = PropertyRecord::IsNumeric((PropertyRecord *)oldType), bVar2)) {
      pDVar6 = ConvertToTypeWithItemAttributes(this,(DynamicObject *)_value_local);
      this_local._4_4_ =
           (*pDVar6->_vptr_DynamicTypeHandler[0x2a])
                     (pDVar6,_value_local,(ulong)descriptor._4_4_,(ulong)(uint)descriptor);
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetWritable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (!propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            if (instance->HasObjectArray() && propertyRecord->IsNumeric())
            {
                return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToTypeWithItemAttributes(instance)
                    ->SetWritable(instance, propertyId, value);
            }
            return true;
        }

        if (descriptor->Attributes & PropertyLetConstGlobal)
        {
            return true;
        }

        const Type* oldType = instance->GetType();
        if (value)
        {
            if (SetAttribute(instance, descriptor, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches
            }
        }
        else
        {
            if (ClearAttribute(instance, descriptor, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches

                // Clearing the attribute may have changed the type handler, so make sure
                // we access the current one.
                DynamicTypeHandler *const typeHandler = GetCurrentTypeHandler(instance);
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(typeHandler, PropertyNone, propertyId, library->GetScriptContext());
            }
        }
        return true;
    }